

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  memory_buf_t *this_00;
  char *pcVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  char *buf_ptr_2;
  char *__s;
  uint uVar8;
  ulong uVar9;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_string_view<char> fmt_02;
  basic_string_view<char> fmt_03;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_02;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_03;
  ulong local_78 [3];
  long local_60;
  buffer<char> local_58;
  memory_buf_t *local_38;
  
  lVar5 = (msg->time).__d.__r / 1000000000;
  if (((this->cache_timestamp_).__r != lVar5) ||
     ((this->cached_datetime_).super_buffer<char>.size_ == 0)) {
    this_00 = &this->cached_datetime_;
    (this->cached_datetime_).super_buffer<char>.size_ = 0;
    local_60 = lVar5;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ == 0) {
      (**(this_00->super_buffer<char>)._vptr_buffer)(this_00,1);
    }
    pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar1[sVar2] = '[';
    local_58.capacity_ =
         (size_t)::fmt::v9::format_int::format_signed<int>
                           ((format_int *)&local_58,tm_time->tm_year + 0x76c);
    ::fmt::v9::detail::buffer<char>::append<char>
              (&this_00->super_buffer<char>,(char *)local_58.capacity_,
               (char *)((long)&local_58.size_ + 5));
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
    }
    pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar1[sVar2] = '-';
    uVar8 = tm_time->tm_mon + 1;
    if (uVar8 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (byte)((ulong)uVar8 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
    }
    else {
      local_58.size_ = (this->cached_datetime_).super_buffer<char>.size_;
      local_58._vptr_buffer = (_func_int **)&PTR_grow_001cc938;
      fmt.size_ = 5;
      fmt.data_ = "{:02}";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_78;
      args.desc_ = 1;
      local_78[0] = (ulong)uVar8;
      local_58.capacity_ = local_58.size_;
      local_38 = this_00;
      ::fmt::v9::detail::vformat_to<char>(&local_58,fmt,args,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
    }
    pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar1[sVar2] = '-';
    uVar8 = tm_time->tm_mday;
    uVar9 = (ulong)uVar8;
    if (uVar9 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (byte)(uVar9 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
    }
    else {
      local_58.size_ = (this->cached_datetime_).super_buffer<char>.size_;
      local_58._vptr_buffer = (_func_int **)&PTR_grow_001cc938;
      fmt_00.size_ = 5;
      fmt_00.data_ = "{:02}";
      args_00.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_78;
      args_00.desc_ = 1;
      local_78[0] = uVar9;
      local_58.capacity_ = local_58.size_;
      local_38 = this_00;
      ::fmt::v9::detail::vformat_to<char>(&local_58,fmt_00,args_00,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
    }
    pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar1[sVar2] = ' ';
    uVar8 = tm_time->tm_hour;
    uVar9 = (ulong)uVar8;
    if (uVar9 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (byte)(uVar9 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
    }
    else {
      local_58.size_ = (this->cached_datetime_).super_buffer<char>.size_;
      local_58._vptr_buffer = (_func_int **)&PTR_grow_001cc938;
      fmt_01.size_ = 5;
      fmt_01.data_ = "{:02}";
      args_01.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_78;
      args_01.desc_ = 1;
      local_78[0] = uVar9;
      local_58.capacity_ = local_58.size_;
      local_38 = this_00;
      ::fmt::v9::detail::vformat_to<char>(&local_58,fmt_01,args_01,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
    }
    pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar1[sVar2] = ':';
    uVar8 = tm_time->tm_min;
    uVar9 = (ulong)uVar8;
    if (uVar9 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (byte)(uVar9 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
    }
    else {
      local_58.size_ = (this->cached_datetime_).super_buffer<char>.size_;
      local_58._vptr_buffer = (_func_int **)&PTR_grow_001cc938;
      fmt_02.size_ = 5;
      fmt_02.data_ = "{:02}";
      args_02.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_78;
      args_02.desc_ = 1;
      local_78[0] = uVar9;
      local_58.capacity_ = local_58.size_;
      local_38 = this_00;
      ::fmt::v9::detail::vformat_to<char>(&local_58,fmt_02,args_02,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
    }
    pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar1[sVar2] = ':';
    uVar8 = tm_time->tm_sec;
    uVar9 = (ulong)uVar8;
    if (uVar9 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (byte)(uVar9 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
      }
      pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar1[sVar2] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
    }
    else {
      local_58.size_ = (this->cached_datetime_).super_buffer<char>.size_;
      local_58._vptr_buffer = (_func_int **)&PTR_grow_001cc938;
      fmt_03.size_ = 5;
      fmt_03.data_ = "{:02}";
      args_03.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_78;
      args_03.desc_ = 1;
      local_78[0] = uVar9;
      local_58.capacity_ = local_58.size_;
      local_38 = this_00;
      ::fmt::v9::detail::vformat_to<char>(&local_58,fmt_03,args_03,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(this_00->super_buffer<char>)._vptr_buffer)(this_00);
    }
    pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar1[sVar2] = '.';
    (this->cache_timestamp_).__r = local_60;
  }
  pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
  ::fmt::v9::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,pcVar1,
             pcVar1 + (this->cached_datetime_).super_buffer<char>.size_);
  lVar5 = (msg->time).__d.__r;
  auVar3 = SEXT816(lVar5) * SEXT816(0x112e0be826d694b3);
  auVar4 = SEXT816(lVar5) * SEXT816(0x431bde82d7b634db);
  fmt_helper::pad3<unsigned_int>
            (((int)(auVar3._8_8_ >> 0x1a) - (auVar3._12_4_ >> 0x1f)) * -1000 +
             ((int)(auVar4._8_8_ >> 0x12) - (auVar4._12_4_ >> 0x1f)),dest);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ']';
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  if ((msg->logger_name).size_ != 0) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = '[';
    pcVar1 = (msg->logger_name).data_;
    ::fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,pcVar1,pcVar1 + (msg->logger_name).size_);
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ']';
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = '[';
  msg->color_range_start = (dest->super_buffer<char>).size_;
  lVar5 = (long)(int)msg->level * 0x10;
  ::fmt::v9::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,*(char **)(level::level_string_views + lVar5),
             *(char **)(level::level_string_views + lVar5) +
             *(long *)(level::level_string_views + lVar5 + 8));
  sVar2 = (dest->super_buffer<char>).size_;
  msg->color_range_end = sVar2;
  if ((dest->super_buffer<char>).capacity_ < sVar2 + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ']';
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  if ((msg->source).line != 0) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = '[';
    pcVar1 = (msg->source).filename;
    pcVar6 = strrchr(pcVar1,0x2f);
    __s = pcVar6 + 1;
    if (pcVar6 == (char *)0x0) {
      __s = pcVar1;
    }
    sVar7 = strlen(__s);
    ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar7);
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ':';
    local_58.capacity_ =
         (size_t)::fmt::v9::format_int::format_signed<int>
                           ((format_int *)&local_58,(msg->source).line);
    ::fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,(char *)local_58.capacity_,
               (char *)((long)&local_58.size_ + 5));
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ']';
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  }
  pcVar1 = (msg->payload).data_;
  ::fmt::v9::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,pcVar1,pcVar1 + (msg->payload).size_);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0)
        {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

        // append logger name if exists
        if (msg.logger_name.size() > 0)
        {
            dest.push_back('[');
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty())
        {
            dest.push_back('[');
            const char *filename = details::short_filename_formatter<details::null_scoped_padder>::basename(msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }